

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O1

bool __thiscall iDynTree::AttitudeMahonyFilter::propagateStates(AttitudeMahonyFilter *this)

{
  AttitudeEstimatorState *q1;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  RealScalar z;
  double dVar10;
  UnitQuaternion q;
  UnitQuaternion local_98;
  undefined1 local_78 [72];
  double local_30;
  double dStack_28;
  double local_20;
  
  dVar5 = (this->m_params_mahony).time_step_in_seconds;
  dVar10 = (this->m_params_mahony).kp;
  dVar6 = dVar5 * (dVar10 * (this->m_omega_mes).m_data[0] +
                  ((this->m_Omega_y).m_data[0] - (this->m_state_mahony).m_gyroscope_bias.m_data[0]))
          * 0.5;
  dVar9 = dVar5 * (dVar10 * (this->m_omega_mes).m_data[1] +
                  ((this->m_Omega_y).m_data[1] - (this->m_state_mahony).m_gyroscope_bias.m_data[1]))
          * 0.5;
  q1 = &this->m_state_mahony;
  dVar10 = (dVar10 * (this->m_omega_mes).m_data[2] +
           ((this->m_Omega_y).m_data[2] - (this->m_state_mahony).m_gyroscope_bias.m_data[2])) *
           dVar5 * 0.5;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 0.0;
  local_98.m_data[3] = 0.0;
  local_98.m_data[0] = 1.0;
  dVar5 = SQRT(dVar10 * dVar10 + dVar9 * dVar9 + dVar6 * dVar6);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar4 = cos(dVar5 * 0.5);
    local_98.m_data[2] = sin(dVar5 * 0.5);
    local_98.m_data[2] = local_98.m_data[2] / dVar5;
    local_98.m_data[3] = dVar10 * local_98.m_data[2];
    local_98.m_data[1] = dVar6 * local_98.m_data[2];
    local_98.m_data[2] = dVar9 * local_98.m_data[2];
    local_98.m_data[0] = dVar4;
  }
  composeQuaternion2((UnitQuaternion *)local_78,&q1->m_orientation,&local_98);
  *(undefined1 (*) [16])(this->m_state_mahony).m_orientation.m_data = local_78._0_16_;
  *(undefined1 (*) [16])((this->m_state_mahony).m_orientation.m_data + 2) = local_78._16_16_;
  dVar5 = local_78._24_8_ * local_78._24_8_ + local_78._8_8_ * local_78._8_8_ +
          local_78._16_8_ * local_78._16_8_ + local_78._0_8_ * local_78._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar5;
  auVar7 = sqrtpd(auVar7,auVar7);
  auVar8._0_8_ = auVar7._0_8_;
  dVar6 = ABS(auVar8._0_8_);
  dVar10 = dVar6 * 2.220446049250313e-16 * 4.0;
  if (dVar6 <= dVar10) {
    iDynTree::reportError
              ("AttitudeMahonyFilter","propagateStates","invalid quaternion with zero norm");
  }
  else {
    dVar9 = 1.0;
    if (1.0 <= dVar6) {
      dVar9 = dVar6;
    }
    if ((dVar9 * 2.220446049250313e-16 * 4.0 < ABS(auVar8._0_8_ + -1.0)) && (0.0 < dVar5)) {
      auVar8._8_8_ = auVar8._0_8_;
      auVar7 = divpd(local_78._0_16_,auVar8);
      *(undefined1 (*) [16])(this->m_state_mahony).m_orientation.m_data = auVar7;
      auVar7 = divpd(local_78._16_16_,auVar8);
      *(undefined1 (*) [16])((this->m_state_mahony).m_orientation.m_data + 2) = auVar7;
    }
    dVar5 = (this->m_Omega_y).m_data[1];
    dVar1 = (this->m_state_mahony).m_gyroscope_bias.m_data[0];
    dVar2 = (this->m_state_mahony).m_gyroscope_bias.m_data[1];
    (this->m_state_mahony).m_angular_velocity.m_data[0] = (this->m_Omega_y).m_data[0] - dVar1;
    (this->m_state_mahony).m_angular_velocity.m_data[1] = dVar5 - dVar2;
    dVar5 = (this->m_state_mahony).m_gyroscope_bias.m_data[2];
    (this->m_state_mahony).m_angular_velocity.m_data[2] = (this->m_Omega_y).m_data[2] - dVar5;
    dVar9 = (this->m_params_mahony).time_step_in_seconds;
    dVar4 = (this->m_params_mahony).ki;
    dVar3 = (this->m_omega_mes).m_data[1];
    (this->m_state_mahony).m_gyroscope_bias.m_data[0] =
         dVar1 - dVar9 * dVar4 * (this->m_omega_mes).m_data[0];
    (this->m_state_mahony).m_gyroscope_bias.m_data[1] = dVar2 - dVar9 * dVar4 * dVar3;
    (this->m_state_mahony).m_gyroscope_bias.m_data[2] =
         dVar5 - dVar4 * (this->m_omega_mes).m_data[2] * dVar9;
    iDynTree::Rotation::RotationFromQuaternion((Rotation *)local_78,(VectorFixSize *)q1);
    iDynTree::Rotation::operator=(&this->m_orientationInSO3,(Rotation *)local_78);
    iDynTree::Rotation::RotationFromQuaternion((Rotation *)local_78,(VectorFixSize *)q1);
    iDynTree::Rotation::asRPY();
    (this->m_orientationInRPY).m_data[2] = local_20;
    (this->m_orientationInRPY).m_data[0] = local_30;
    (this->m_orientationInRPY).m_data[1] = dStack_28;
  }
  return dVar10 < dVar6;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::propagateStates()
{
    using iDynTree::toEigen;
    iDynTree::Vector3 gyro_update_dyn;
    auto q(toEigen(m_state_mahony.m_orientation));
    auto Omega(toEigen(m_state_mahony.m_angular_velocity));
    auto b(toEigen(m_state_mahony.m_gyroscope_bias));
    auto gyroUpdate(toEigen(gyro_update_dyn));
    auto Omega_y(toEigen(m_Omega_y));
    auto omega_mes(toEigen(m_omega_mes));

    // compute the correction from the measurements
    gyroUpdate = (Omega_y - b + (omega_mes*m_params_mahony.kp))*m_params_mahony.time_step_in_seconds*0.5;
    iDynTree::UnitQuaternion correction = expQuaternion(gyro_update_dyn);

    // system dynamics equations
    q = toEigen(composeQuaternion2(m_state_mahony.m_orientation, correction));

    int precision{4};
    double malformed_unit_quaternion_norm{0.0};
    if (check_are_almost_equal(q.norm(), malformed_unit_quaternion_norm, precision))
    {
        reportError("AttitudeMahonyFilter", "propagateStates", "invalid quaternion with zero norm");
        return false;
    }

    double unit_quaternion_norm{1.0};
    if (!check_are_almost_equal(q.norm(), unit_quaternion_norm, precision))
    {
        q.normalize();
    }
    Omega = Omega_y - b;
    b = b - (omega_mes*m_params_mahony.ki)*(m_params_mahony.time_step_in_seconds);

    m_orientationInSO3 = iDynTree::Rotation::RotationFromQuaternion(m_state_mahony.m_orientation);
    m_orientationInRPY = iDynTree::Rotation::RotationFromQuaternion(m_state_mahony.m_orientation).asRPY();

    return true;
}